

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

kTRContinueMode int_trp_assert_error_v2(int line,char *file,char *exp)

{
  kTRContinueMode kVar1;
  element_type *this;
  TestResponseProxy *this_00;
  shared_ptr<trun::TestModule> local_30;
  char *local_20;
  char *exp_local;
  char *file_local;
  int line_local;
  
  local_20 = exp;
  exp_local = file;
  file_local._4_4_ = line;
  trun::TestRunner::GetCurrentTestModule();
  this = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&local_30);
  this_00 = trun::TestModule::GetTestResponseProxy(this);
  kVar1 = trun::TestResponseProxy::AssertError(this_00,local_20,exp_local,file_local._4_4_);
  std::shared_ptr<trun::TestModule>::~shared_ptr(&local_30);
  return kVar1;
}

Assistant:

static kTRContinueMode int_trp_assert_error_v2(int line, const char *file, const char *exp) {
    // Just swizzle the arguments back to the old interface..
    return TestRunner::GetCurrentTestModule()->GetTestResponseProxy().AssertError(exp, file, line);
}